

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

bool __thiscall slang::ast::SequenceConcatExpr::admitsEmptyImpl(SequenceConcatExpr *this)

{
  bool bVar1;
  iterator pEVar2;
  iterator pEVar3;
  AssertionExpr *pAVar4;
  __optional_eq_t<unsigned_int,_unsigned_int> local_41;
  uint local_24;
  iterator local_20;
  iterator it;
  SequenceConcatExpr *this_local;
  
  it = (iterator)this;
  pEVar2 = nonstd::span_lite::
           span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>::begin
                     (&this->elements);
  local_20 = pEVar2;
  pEVar3 = nonstd::span_lite::
           span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>::end
                     (&this->elements);
  if (pEVar2 == pEVar3) {
    assert::assertFailed
              ("it != elements.end()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssertionExpr.cpp"
               ,0x25e,"bool slang::ast::SequenceConcatExpr::admitsEmptyImpl() const");
  }
  if ((local_20->delay).min == 0) {
    pAVar4 = not_null<const_slang::ast::AssertionExpr_*>::operator->(&local_20->sequence);
    bVar1 = AssertionExpr::admitsEmpty(pAVar4);
    if (bVar1) {
      while( true ) {
        pEVar2 = local_20 + 1;
        local_20 = pEVar2;
        pEVar3 = nonstd::span_lite::
                 span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>::end
                           (&this->elements);
        if (pEVar2 == pEVar3) {
          return true;
        }
        pAVar4 = not_null<const_slang::ast::AssertionExpr_*>::operator->(&local_20->sequence);
        bVar1 = AssertionExpr::admitsEmpty(pAVar4);
        if (!bVar1) break;
        local_41 = false;
        if ((local_20->delay).min == 0) {
          local_24 = 0;
          local_41 = std::operator==(&(local_20->delay).max,&local_24);
        }
        if (local_41 != false) {
          return false;
        }
        if (1 < (local_20->delay).min) {
          return false;
        }
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool SequenceConcatExpr::admitsEmptyImpl() const {
    auto it = elements.begin();
    ASSERT(it != elements.end());

    // See F.3.4.2.2 for the rules here.
    if (it->delay.min != 0 || !it->sequence->admitsEmpty())
        return false;

    while (++it != elements.end()) {
        if (!it->sequence->admitsEmpty())
            return false;

        if (it->delay.min == 0u && it->delay.max == 0u)
            return false;

        if (it->delay.min > 1)
            return false;
    }

    return true;
}